

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogUnWrapURN(xmlChar *urn)

{
  int iVar1;
  xmlChar *pxVar2;
  uint uVar3;
  uint local_7ec;
  xmlChar local_7e8 [4];
  uint i;
  xmlChar result [2000];
  xmlChar *urn_local;
  
  local_7ec = 0;
  result._1992_8_ = urn;
  iVar1 = xmlStrncmp(urn,(xmlChar *)"urn:publicid:",0xd);
  if (iVar1 != 0) {
    return (xmlChar *)0x0;
  }
  result._1992_8_ = result._1992_8_ + 0xd;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((*(char *)result._1992_8_ == '\0') || (0x7cc < local_7ec)) {
              local_7e8[local_7ec] = '\0';
              pxVar2 = xmlStrdup(local_7e8);
              return pxVar2;
            }
            if (*(char *)result._1992_8_ != '+') break;
            local_7e8[local_7ec] = ' ';
            result._1992_8_ = result._1992_8_ + 1;
            local_7ec = local_7ec + 1;
          }
          if (*(char *)result._1992_8_ != ':') break;
          uVar3 = local_7ec + 1;
          local_7e8[local_7ec] = '/';
          local_7ec = local_7ec + 2;
          local_7e8[uVar3] = '/';
          result._1992_8_ = result._1992_8_ + 1;
        }
        if (*(char *)result._1992_8_ != ';') break;
        uVar3 = local_7ec + 1;
        local_7e8[local_7ec] = ':';
        local_7ec = local_7ec + 2;
        local_7e8[uVar3] = ':';
        result._1992_8_ = result._1992_8_ + 1;
      }
      if (*(char *)result._1992_8_ == '%') break;
      local_7e8[local_7ec] = *(xmlChar *)result._1992_8_;
      result._1992_8_ = result._1992_8_ + 1;
LAB_0018c880:
      local_7ec = local_7ec + 1;
    }
    if ((*(char *)(result._1992_8_ + 1) == '2') && (*(char *)(result._1992_8_ + 2) == 'B')) {
      local_7e8[local_7ec] = '+';
LAB_0018c846:
      result._1992_8_ = result._1992_8_ + 3;
      goto LAB_0018c880;
    }
    if ((*(char *)(result._1992_8_ + 1) == '3') && (*(char *)(result._1992_8_ + 2) == 'A')) {
      local_7e8[local_7ec] = ':';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '2') && (*(char *)(result._1992_8_ + 2) == 'F')) {
      local_7e8[local_7ec] = '/';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '3') && (*(char *)(result._1992_8_ + 2) == 'B')) {
      local_7e8[local_7ec] = ';';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '2') && (*(char *)(result._1992_8_ + 2) == '7')) {
      local_7e8[local_7ec] = '\'';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '3') && (*(char *)(result._1992_8_ + 2) == 'F')) {
      local_7e8[local_7ec] = '?';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '2') && (*(char *)(result._1992_8_ + 2) == '3')) {
      local_7e8[local_7ec] = '#';
      goto LAB_0018c846;
    }
    if ((*(char *)(result._1992_8_ + 1) == '2') && (*(char *)(result._1992_8_ + 2) == '5')) {
      local_7e8[local_7ec] = '%';
      goto LAB_0018c846;
    }
    local_7e8[local_7ec] = *(xmlChar *)result._1992_8_;
    result._1992_8_ = result._1992_8_ + 1;
    local_7ec = local_7ec + 1;
  } while( true );
}

Assistant:

static xmlChar *
xmlCatalogUnWrapURN(const xmlChar *urn) {
    xmlChar result[2000];
    unsigned int i = 0;

    if (xmlStrncmp(urn, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1))
	return(NULL);
    urn += sizeof(XML_URN_PUBID) - 1;

    while (*urn != 0) {
	if (i > sizeof(result) - 4)
	    break;
	if (*urn == '+') {
	    result[i++] = ' ';
	    urn++;
	} else if (*urn == ':') {
	    result[i++] = '/';
	    result[i++] = '/';
	    urn++;
	} else if (*urn == ';') {
	    result[i++] = ':';
	    result[i++] = ':';
	    urn++;
	} else if (*urn == '%') {
	    if ((urn[1] == '2') && (urn[2] == 'B'))
		result[i++] = '+';
	    else if ((urn[1] == '3') && (urn[2] == 'A'))
		result[i++] = ':';
	    else if ((urn[1] == '2') && (urn[2] == 'F'))
		result[i++] = '/';
	    else if ((urn[1] == '3') && (urn[2] == 'B'))
		result[i++] = ';';
	    else if ((urn[1] == '2') && (urn[2] == '7'))
		result[i++] = '\'';
	    else if ((urn[1] == '3') && (urn[2] == 'F'))
		result[i++] = '?';
	    else if ((urn[1] == '2') && (urn[2] == '3'))
		result[i++] = '#';
	    else if ((urn[1] == '2') && (urn[2] == '5'))
		result[i++] = '%';
	    else {
		result[i++] = *urn;
		urn++;
		continue;
	    }
	    urn += 3;
	} else {
	    result[i++] = *urn;
	    urn++;
	}
    }
    result[i] = 0;

    return(xmlStrdup(result));
}